

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O1

void cf_gcm_encrypt_init(cf_prp *prp,void *prpctx,cf_gcm_ctx *gcmctx,uint8_t *header,size_t nheader,
                        uint8_t *nonce,size_t nnonce)

{
  ghash_ctx *ctx;
  uint8_t H [16];
  uint8_t local_48 [24];
  
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  local_48[4] = '\0';
  local_48[5] = '\0';
  local_48[6] = '\0';
  local_48[7] = '\0';
  local_48[8] = '\0';
  local_48[9] = '\0';
  local_48[10] = '\0';
  local_48[0xb] = '\0';
  local_48[0xc] = '\0';
  local_48[0xd] = '\0';
  local_48[0xe] = '\0';
  local_48[0xf] = '\0';
  (*prp->encrypt)(prpctx,local_48,local_48);
  if (nnonce == 0xc) {
    *(undefined4 *)(gcmctx->Y0 + 8) = *(undefined4 *)(nonce + 8);
    *(undefined8 *)gcmctx->Y0 = *(undefined8 *)nonce;
    gcmctx->Y0[0xc] = '\0';
    gcmctx->Y0[0xd] = '\0';
    gcmctx->Y0[0xe] = '\0';
    gcmctx->Y0[0xf] = '\x01';
  }
  else {
    ctx = &gcmctx->gh;
    (gcmctx->gh).len_cipher = 0;
    *(undefined8 *)&(gcmctx->gh).state = 0;
    (gcmctx->gh).buffer_used = 0;
    (gcmctx->gh).len_aad = 0;
    (gcmctx->gh).buffer[0] = '\0';
    (gcmctx->gh).buffer[1] = '\0';
    (gcmctx->gh).buffer[2] = '\0';
    (gcmctx->gh).buffer[3] = '\0';
    (gcmctx->gh).buffer[4] = '\0';
    (gcmctx->gh).buffer[5] = '\0';
    (gcmctx->gh).buffer[6] = '\0';
    (gcmctx->gh).buffer[7] = '\0';
    (gcmctx->gh).buffer[8] = '\0';
    (gcmctx->gh).buffer[9] = '\0';
    (gcmctx->gh).buffer[10] = '\0';
    (gcmctx->gh).buffer[0xb] = '\0';
    (gcmctx->gh).buffer[0xc] = '\0';
    (gcmctx->gh).buffer[0xd] = '\0';
    (gcmctx->gh).buffer[0xe] = '\0';
    (gcmctx->gh).buffer[0xf] = '\0';
    (gcmctx->gh).Y[0] = 0;
    (gcmctx->gh).Y[1] = 0;
    (gcmctx->gh).Y[2] = 0;
    (gcmctx->gh).Y[3] = 0;
    (gcmctx->gh).H[0] = 0;
    (gcmctx->gh).H[1] = 0;
    (gcmctx->gh).H[2] = 0;
    (gcmctx->gh).H[3] = 0;
    cf_gf128_frombytes_be(local_48,ctx->H);
    (gcmctx->gh).state = 1;
    ghash_add_cipher(ctx,nonce,nnonce);
    ghash_final(ctx,gcmctx->Y0);
  }
  (gcmctx->gh).len_cipher = 0;
  *(undefined8 *)&(gcmctx->gh).state = 0;
  (gcmctx->gh).buffer_used = 0;
  (gcmctx->gh).len_aad = 0;
  (gcmctx->gh).buffer[0] = '\0';
  (gcmctx->gh).buffer[1] = '\0';
  (gcmctx->gh).buffer[2] = '\0';
  (gcmctx->gh).buffer[3] = '\0';
  (gcmctx->gh).buffer[4] = '\0';
  (gcmctx->gh).buffer[5] = '\0';
  (gcmctx->gh).buffer[6] = '\0';
  (gcmctx->gh).buffer[7] = '\0';
  (gcmctx->gh).buffer[8] = '\0';
  (gcmctx->gh).buffer[9] = '\0';
  (gcmctx->gh).buffer[10] = '\0';
  (gcmctx->gh).buffer[0xb] = '\0';
  (gcmctx->gh).buffer[0xc] = '\0';
  (gcmctx->gh).buffer[0xd] = '\0';
  (gcmctx->gh).buffer[0xe] = '\0';
  (gcmctx->gh).buffer[0xf] = '\0';
  (gcmctx->gh).Y[0] = 0;
  (gcmctx->gh).Y[1] = 0;
  (gcmctx->gh).Y[2] = 0;
  (gcmctx->gh).Y[3] = 0;
  (gcmctx->gh).H[0] = 0;
  (gcmctx->gh).H[1] = 0;
  (gcmctx->gh).H[2] = 0;
  (gcmctx->gh).H[3] = 0;
  cf_gf128_frombytes_be(local_48,(gcmctx->gh).H);
  (gcmctx->gh).state = 1;
  ghash_add_aad(&gcmctx->gh,header,nheader);
  gcmctx->e_Y0[0] = '\0';
  gcmctx->e_Y0[1] = '\0';
  gcmctx->e_Y0[2] = '\0';
  gcmctx->e_Y0[3] = '\0';
  gcmctx->e_Y0[4] = '\0';
  gcmctx->e_Y0[5] = '\0';
  gcmctx->e_Y0[6] = '\0';
  gcmctx->e_Y0[7] = '\0';
  gcmctx->e_Y0[8] = '\0';
  gcmctx->e_Y0[9] = '\0';
  gcmctx->e_Y0[10] = '\0';
  gcmctx->e_Y0[0xb] = '\0';
  gcmctx->e_Y0[0xc] = '\0';
  gcmctx->e_Y0[0xd] = '\0';
  gcmctx->e_Y0[0xe] = '\0';
  gcmctx->e_Y0[0xf] = '\0';
  cf_ctr_init(&gcmctx->ctr,prp,prpctx,gcmctx->Y0);
  cf_ctr_custom_counter(&gcmctx->ctr,0xc,4);
  cf_ctr_cipher(&gcmctx->ctr,gcmctx->e_Y0,gcmctx->e_Y0,0x10);
  return;
}

Assistant:

void cf_gcm_encrypt_init(const cf_prp *prp, void *prpctx, cf_gcm_ctx *gcmctx,
                         const uint8_t *header, size_t nheader,
                         const uint8_t *nonce, size_t nnonce)
{
  uint8_t H[16] = { 0 };

  /* H = E_K(0^128) */
  prp->encrypt(prpctx, H, H);

  /* Produce CTR nonce, Y_0:
   *
   * if len(IV) == 96
   *   Y_0 = IV || 0^31 || 1
   * otherwise
   *   Y_0 = GHASH(H, {}, IV)
   */

  if (nnonce == 12)
  {
    memcpy(gcmctx->Y0, nonce, nnonce);
    gcmctx->Y0[12] = gcmctx->Y0[13] = gcmctx->Y0[14] = 0x00;
    gcmctx->Y0[15] = 0x01;
  } else {
    ghash_init(&gcmctx->gh, H);
    ghash_add_cipher(&gcmctx->gh, nonce, nnonce);
    ghash_final(&gcmctx->gh, gcmctx->Y0);
  }

  /* Hash AAD */
  ghash_init(&gcmctx->gh, H);
  ghash_add_aad(&gcmctx->gh, header, nheader);

  /* Produce ciphertext */
  memset(gcmctx->e_Y0, 0, sizeof(gcmctx->e_Y0));
  cf_ctr_init(&gcmctx->ctr, prp, prpctx, gcmctx->Y0);
  cf_ctr_custom_counter(&gcmctx->ctr, 12, 4); /* counter is 2^32 */
  cf_ctr_cipher(&gcmctx->ctr, gcmctx->e_Y0, gcmctx->e_Y0, sizeof gcmctx->e_Y0); /* first block is tag offset */

  mem_clean(H, sizeof H);
}